

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

int Dsm_ManTruthToGia(void *p,word *pTruth,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  word pTruthCopy [64];
  char pDsd [1000];
  
  iVar3 = vLeaves->nSize;
  bVar1 = (char)iVar3 - 6U & 0x1f;
  uVar5 = 0;
  uVar4 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar4 = uVar5;
  }
  if (iVar3 < 7) {
    uVar4 = 1;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pTruthCopy[uVar5] = pTruth[uVar5];
  }
  m_Calls = m_Calls + 1;
  if (iVar3 < 0xd) {
    if (iVar3 != 1) {
      if (iVar3 == 0) {
        uVar2 = (uint)*pTruth & 1;
      }
      else {
        iVar3 = Dau_DsdDecompose(pTruthCopy,iVar3,0,1,pDsd);
        if (iVar3 != 0) {
          m_NonDsd = m_NonDsd + 1;
        }
        if (*(long *)((long)p + 0xa0) == 0) {
          uVar2 = Dau_DsdToGia2((Gia_Man_t *)p,pDsd,vLeaves->pArray,vCover);
        }
        else {
          uVar2 = Dau_DsdToGia((Gia_Man_t *)p,pDsd,vLeaves->pArray,vCover);
        }
      }
      return uVar2;
    }
    iVar3 = Vec_IntEntry(vLeaves,0);
    iVar3 = Abc_LitNotCond(iVar3,(uint)*pTruth & 1);
    return iVar3;
  }
  __assert_fail("Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                ,0x1c3,"int Dsm_ManTruthToGia(void *, word *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Dsm_ManTruthToGia( void * p, word * pTruth, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    int fUseMuxes = 0;
    int fDelayBalance = 1;
    Gia_Man_t * pGia = (Gia_Man_t *)p;
    int nSizeNonDec;
    char pDsd[1000];
    word pTruthCopy[DAU_MAX_WORD];
    Abc_TtCopy( pTruthCopy, pTruth, Abc_TtWordNum(Vec_IntSize(vLeaves)), 0 );
    m_Calls++;
    assert( Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR );
    if ( Vec_IntSize(vLeaves) == 0 )
        return (int)(pTruth[0] & 1);
    if ( Vec_IntSize(vLeaves) == 1 )
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), (int)(pTruth[0] & 1) );
    // collect delay information
    if ( fDelayBalance && fUseMuxes )
    {
        int i, iLit, pVarLevels[DAU_DSD_MAX_VAR];
        Vec_IntForEachEntry( vLeaves, iLit, i )
            pVarLevels[i] = Gia_ObjLevelId( pGia, Abc_Lit2Var(iLit) );
        nSizeNonDec = Dau_DsdDecomposeLevel( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd, pVarLevels );
    }
    else
        nSizeNonDec = Dau_DsdDecompose( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd );
    if ( nSizeNonDec )
        m_NonDsd++;
//    printf( "%s\n", pDsd );
    if ( fDelayBalance && pGia->vLevels )
        return Dau_DsdToGia( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
    else
        return Dau_DsdToGia2( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
}